

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialvalue.cpp
# Opt level: O2

void __thiscall
ConfidentialValue_Constractor_hex33_Test::TestBody(ConfidentialValue_Constractor_hex33_Test *this)

{
  bool bVar1;
  char *pcVar2;
  Amount AVar3;
  AssertHelper local_70;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_2;
  int local_34;
  ConfidentialValue value;
  
  std::__cxx11::string::string
            ((string *)&gtest_ar_2,
             "09b6e7605917e27f35690dcae922f664c8a3b057e2c6249db6cd304096aa87a226",
             (allocator *)&gtest_ar);
  cfd::core::ConfidentialValue::ConfidentialValue(&value,(string *)&gtest_ar_2);
  std::__cxx11::string::~string((string *)&gtest_ar_2);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_((string *)&gtest_ar_2,&value);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"value.GetHex().c_str()",
             "\"09b6e7605917e27f35690dcae922f664c8a3b057e2c6249db6cd304096aa87a226\"",
             (char *)CONCAT71(gtest_ar_2._1_7_,gtest_ar_2.success_),
             "09b6e7605917e27f35690dcae922f664c8a3b057e2c6249db6cd304096aa87a226");
  std::__cxx11::string::~string((string *)&gtest_ar_2);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_2);
    if ((undefined8 *)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_) ==
        (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialvalue.cpp"
               ,0x40,pcVar2);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::ConfidentialValue::GetData((ByteData *)&gtest_ar_2,&value);
  local_70.data_ = (AssertHelperData *)cfd::core::ByteData::GetDataSize((ByteData *)&gtest_ar_2);
  local_34 = 0x21;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar,"value.GetData().GetDataSize()","33",(unsigned_long *)&local_70,
             &local_34);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_2);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_2);
    if ((undefined8 *)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_) ==
        (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialvalue.cpp"
               ,0x41,pcVar2);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  bVar1 = cfd::core::ConfidentialValue::HasBlinding(&value);
  gtest_ar.success_ = bVar1;
  local_70.data_._0_1_ = 1;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&gtest_ar_2,"value.HasBlinding()","true",&gtest_ar.success_,
             (bool *)&local_70);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialvalue.cpp"
               ,0x42,pcVar2);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  AVar3 = cfd::core::ConfidentialValue::GetAmount(&value);
  gtest_ar._0_8_ = AVar3.amount_;
  gtest_ar.message_.ptr_._0_1_ = AVar3.ignore_check_;
  local_70.data_ = (AssertHelperData *)cfd::core::Amount::GetSatoshiValue((Amount *)&gtest_ar);
  local_34 = 0;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar_2,"value.GetAmount().GetSatoshiValue()","0",(long *)&local_70,
             &local_34);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialvalue.cpp"
               ,0x43,pcVar2);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  cfd::core::ConfidentialValue::~ConfidentialValue(&value);
  return;
}

Assistant:

TEST(ConfidentialValue, Constractor_hex33) {
  // 33byte
  ConfidentialValue value(
      "09b6e7605917e27f35690dcae922f664c8a3b057e2c6249db6cd304096aa87a226");
  EXPECT_STREQ(
      value.GetHex().c_str(),
      "09b6e7605917e27f35690dcae922f664c8a3b057e2c6249db6cd304096aa87a226");
  EXPECT_EQ(value.GetData().GetDataSize(), 33);
  EXPECT_EQ(value.HasBlinding(), true);
  EXPECT_EQ(value.GetAmount().GetSatoshiValue(), 0);
}